

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_traits.hpp
# Opt level: O2

type jsoncons::unicode_traits::detect_json_encoding<char>(char *data,size_t length)

{
  type tVar1;
  type tVar2;
  type tVar3;
  type tVar4;
  undefined8 uStack_20;
  
  tVar4 = detect_encoding_from_bom<char>(data,length);
  if (tVar4.encoding != undetected) {
    return tVar4;
  }
  tVar1._8_8_ = 1;
  tVar1.ptr = data;
  tVar3._8_8_ = 1;
  tVar3.ptr = data;
  tVar4._8_8_ = 1;
  tVar4.ptr = data;
  tVar2._8_8_ = 1;
  tVar2.ptr = data;
  if (length < 4) {
    return tVar1;
  }
  if (*data == '\0') {
    if (data[1] == '\0') {
      if (data[2] != '\0') goto LAB_00281651;
      uStack_20 = 5;
    }
    else {
      if (data[2] != '\0') {
        return tVar3;
      }
      uStack_20 = 3;
    }
    tVar4._8_8_ = uStack_20;
  }
  else {
    if (data[1] != '\0') {
      return tVar2;
    }
LAB_00281651:
    if (data[3] == '\0') {
      tVar4.encoding = (uint)(data[2] == '\0') * 2 + 2;
      tVar4._12_4_ = 0;
    }
  }
  return tVar4;
}

Assistant:

typename std::enable_if<ext_traits::is_char8<CharT>::value,detect_encoding_result<CharT>>::type
    detect_json_encoding(const CharT* data, std::size_t length)
    {
        detect_encoding_result<CharT> r = detect_encoding_from_bom(data,length);
        if (r.encoding != encoding_kind::undetected)
        {
            return r;
        }
        else if (length < 4)
        {
            return detect_encoding_result<CharT>{data,encoding_kind::utf8};
        }
        else if (*data == 0 && *(data+1) == 0 && *(data+2) == 0)
        {
            return detect_encoding_result<CharT>{data,encoding_kind::utf32be};
        }
        else if (*data == 0 && *(data+2) == 0)
        {
            return detect_encoding_result<CharT>{data,encoding_kind::utf16be};
        }
        else if (*(data+1) == 0 && *(data+2) == 0 && *(data+3) == 0)
        {
            return detect_encoding_result<CharT>{data,encoding_kind::utf32le};
        }
        else if (*(data+1) == 0 && *(data+3) == 0)
        {
            return detect_encoding_result<CharT>{data,encoding_kind::utf16le};
        }
        else
        {
            return detect_encoding_result<CharT>{data,encoding_kind::utf8};
        }
    }